

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O1

bool __thiscall
cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line,long col)

{
  _Alloc_hider _Var1;
  cmMessenger *this_00;
  undefined8 this_01;
  undefined8 uVar2;
  bool bVar3;
  cmListFileLexer_Token *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ostream *poVar7;
  Delimiter delim;
  anon_enum_32 aVar8;
  long lVar9;
  cmListFileBacktrace lfbt;
  cmListFileContext lfc;
  ostringstream error;
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [64];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  string local_188 [8];
  element_type *peStack_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  undefined8 uStack_170;
  long local_168;
  long lStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined1 local_148 [16];
  pointer local_138;
  
  local_1a8._24_8_ = 0;
  uStack_170 = 0;
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  lStack_160 = 0;
  local_138 = (pointer)0x0;
  local_188 = (string  [8])&local_178;
  _Var1._M_p = local_1a8 + 0x10;
  local_1a8._8_8_ = 0;
  local_1a8._16_8_ = 0;
  peStack_180 = (element_type *)0x0;
  local_178._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_218._56_8_ = line;
  local_1c8._16_8_ = col;
  local_1c8._24_8_ = name;
  local_1a8._0_8_ = _Var1._M_p;
  std::__cxx11::string::operator=((string *)&this->Function,(string *)local_1a8);
  std::__cxx11::string::operator=
            ((string *)&(this->Function).super_cmCommandContext.Name.Original,local_188);
  *(undefined4 *)&(this->Function).super_cmCommandContext.EndLine = (undefined4)local_158;
  *(undefined4 *)((long)&(this->Function).super_cmCommandContext.EndLine + 4) = local_158._4_4_;
  *(undefined4 *)&(this->Function).super_cmCommandContext.EndCol = (undefined4)uStack_150;
  *(undefined4 *)((long)&(this->Function).super_cmCommandContext.EndCol + 4) = uStack_150._4_4_;
  (this->Function).super_cmCommandContext.Line = local_168;
  (this->Function).super_cmCommandContext.Col = lStack_160;
  local_228._M_allocated_capacity =
       (size_type)
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_228._8_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_218._0_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_148._0_8_;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_148._8_8_;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_138;
  local_148._0_8_ = (pointer)0x0;
  local_148._8_8_ = (pointer)0x0;
  local_138 = (pointer)0x0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)(local_238 + 0x10));
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_148);
  if (local_188 != (string  [8])&local_178) {
    operator_delete((void *)local_188,(ulong)((long)&(local_178._M_pi)->_vptr__Sp_counted_base + 1))
    ;
  }
  if ((pointer)local_1a8._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,(char *)local_1c8._24_8_,(allocator<char> *)(local_238 + 0x10));
  cmCommandContext::cmCommandName::operator=((cmCommandName *)&this->Function,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != _Var1._M_p) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  (this->Function).super_cmCommandContext.Line = local_218._56_8_;
  (this->Function).super_cmCommandContext.Col = local_1c8._16_8_;
  do {
    pcVar4 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar4 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unexpected end of file.\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      IssueError(this,(string *)(local_238 + 0x10));
      goto LAB_003496e9;
    }
  } while (pcVar4->type == cmListFileLexer_Token_Space);
  if (pcVar4->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    pcVar4 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar4 != (cmListFileLexer_Token *)0x0) {
      lVar9 = 0;
      do {
        if (pcVar4->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_003493eb;
        }
        switch(pcVar4->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar3 = AddArgument(this,pcVar4,Unquoted);
          aVar8 = SeparationWarning;
          if (!bVar3) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar3 = AddArgument(this,pcVar4,Unquoted);
          if (!bVar3) {
            return false;
          }
          lVar9 = lVar9 + 1;
          goto LAB_003493eb;
        case cmListFileLexer_Token_ParenRight:
          if (lVar9 == 0) {
            (this->Function).super_cmCommandContext.EndLine = (long)pcVar4->line;
            (this->Function).super_cmCommandContext.EndCol = (long)pcVar4->column;
            return true;
          }
          this->Separation = SeparationOkay;
          bVar3 = AddArgument(this,pcVar4,Unquoted);
          if (!bVar3) {
            return false;
          }
          lVar9 = lVar9 + -1;
          aVar8 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar8 = SeparationWarning;
          delim = Quoted;
          goto LAB_003494c2;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar8 = SeparationError;
          delim = Bracket;
LAB_003494c2:
          bVar3 = AddArgument(this,pcVar4,delim);
          if (!bVar3) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar8 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Instead found ",0xe);
          pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
          poVar7 = std::operator<<((ostream *)local_1a8,pcVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," with text \"",0xc);
          poVar7 = std::operator<<(poVar7,pcVar4->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,(string *)(local_238 + 0x10));
          goto LAB_003496e9;
        }
        this->Separation = aVar8;
LAB_003493eb:
        pcVar4 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar4 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_228._8_8_ = (pointer)0x0;
    local_218._0_8_ = local_218._0_8_ & 0xffffffffffffff00;
    local_218._24_8_ = 0;
    local_218[0x20] = 0;
    local_218._48_8_ = 0;
    pcVar6 = this->FileName;
    local_228._M_allocated_capacity = (size_type)(pointer)(local_238 + 0x20);
    local_218._16_8_ = local_218 + 0x20;
    strlen(pcVar6);
    std::__cxx11::string::_M_replace((ulong)(local_218 + 0x10),0,(char *)0x0,(ulong)pcVar6);
    local_218._48_8_ = local_218._56_8_;
    local_238._0_8_ =
         (this->Backtrace).TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_238._8_8_ =
         (this->Backtrace).TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_)->_M_use_count + 1;
      }
    }
    cmListFileBacktrace::Push((cmListFileBacktrace *)local_1d8,(cmListFileContext *)local_238);
    uVar2 = local_1d8._8_8_;
    local_238._0_8_ = local_1d8._0_8_;
    this_01 = local_238._8_8_;
    local_1d8._0_8_ = (element_type *)0x0;
    local_1d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_238._8_8_ = uVar2;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01 !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"End of file reached.",0x14);
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage
              (this_00,FATAL_ERROR,(string *)local_1d8,(cmListFileBacktrace *)local_238);
    if ((element_type *)local_1d8._0_8_ != (element_type *)local_1c8) {
      operator_delete((void *)local_1d8._0_8_,
                      (ulong)&(((map<cmProperty::ScopeType,_cmPropertyDefinitionMap,_std::less<cmProperty::ScopeType>,_std::allocator<std::pair<const_cmProperty::ScopeType,_cmPropertyDefinitionMap>_>_>
                                 *)local_1c8._0_8_)->_M_t)._M_impl.field_0x1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    if ((undefined1 *)local_218._16_8_ != local_218 + 0x20) {
      operator_delete((void *)local_218._16_8_,CONCAT71(local_218._33_7_,local_218[0x20]) + 1);
    }
    if ((pointer)local_228._M_allocated_capacity == (pointer)(local_238 + 0x20)) goto LAB_00349704;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Parse error.  Expected \"(\", got ",0x20);
    pcVar6 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar4->type);
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x90);
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," with text \"",0xc);
    pcVar6 = pcVar4->text;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(undefined8 *)(local_1a8._0_8_ + -0x18) + 0x90);
    }
    else {
      sVar5 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar6,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueError(this,(string *)(local_238 + 0x10));
LAB_003496e9:
    if ((pointer)local_228._M_allocated_capacity == (pointer)(local_238 + 0x20)) goto LAB_00349704;
  }
  operator_delete((void *)local_228._M_allocated_capacity,(ulong)(local_218._0_8_ + 1));
LAB_00349704:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)&local_138);
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line, long col)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;
  this->Function.Col = col;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        this->Function.EndLine = token->line;
        this->Function.EndCol = token->column;
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = line;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(MessageType::FATAL_ERROR, error.str(), lfbt);
  return false;
}